

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FieldDescriptor *field_00;
  FieldGenerator *pFVar5;
  Descriptor *pDVar6;
  FileDescriptor *pFVar7;
  string *psVar8;
  undefined1 uVar9;
  Printer *pPVar10;
  int i_00;
  FieldDescriptor *field_01;
  string local_f8;
  string local_d8;
  string local_b8;
  FieldDescriptor *local_98;
  FieldDescriptor *field;
  int i_1;
  int i;
  string local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar2 = IsMapEntryMessage(this->descriptor_);
  if (bVar2) {
    pFVar7 = Descriptor::file(this->descriptor_);
    bVar2 = HasDescriptorMethods(pFVar7,&this->options_);
    pPVar1 = local_18;
    if (bVar2) {
      pPVar10 = local_18;
      pFVar7 = Descriptor::file(this->descriptor_);
      uVar9 = SUB81(pPVar10,0);
      psVar8 = FileDescriptor::name_abi_cxx11_(pFVar7);
      FileLevelNamespace(&local_38,psVar8);
      pDVar6 = Descriptor::containing_type(this->descriptor_);
      ClassName_abi_cxx11_(&local_58,(cpp *)pDVar6,(Descriptor *)0x0,(bool)uVar9);
      SimpleItoa_abi_cxx11_
                ((string *)&i_1,(protobuf *)(ulong)(uint)this->index_in_file_messages_,i_00);
      io::Printer::Print(pPVar1,
                         "$parent$::$classname$::$classname$() {}\n$parent$::$classname$::$classname$(::google::protobuf::Arena* arena) : SuperType(arena) {}\n::google::protobuf::Metadata $parent$::$classname$::GetMetadata() const {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_metadata[$index$];\n}\nvoid $parent$::$classname$::MergeFrom(\n    const ::google::protobuf::Message& other) {\n  ::google::protobuf::Message::MergeFrom(other);\n}\nvoid $parent$::$classname$::MergeFrom(const $classname$& other) {\n  MergeFromInternal(other);\n}\n\n"
                         ,"file_namespace",&local_38,"parent",&local_58,"classname",
                         &this->classname_,"index",(string *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  else {
    bVar2 = IsAnyMessage(this->descriptor_);
    if (bVar2) {
      io::Printer::Print(local_18,
                         "void $classname$::PackFrom(const ::google::protobuf::Message& message) {\n  _any_metadata_.PackFrom(message);\n}\n\nvoid $classname$::PackFrom(const ::google::protobuf::Message& message,\n                           const ::std::string& type_url_prefix) {\n  _any_metadata_.PackFrom(message, type_url_prefix);\n}\n\nbool $classname$::UnpackTo(::google::protobuf::Message* message) const {\n  return _any_metadata_.UnpackTo(message);\n}\n\n"
                         ,"classname",&this->classname_);
    }
    for (field._4_4_ = 0; iVar4 = field._4_4_, iVar3 = Descriptor::field_count(this->descriptor_),
        iVar4 < iVar3; field._4_4_ = field._4_4_ + 1) {
      field_00 = Descriptor::field(this->descriptor_,field._4_4_);
      pFVar5 = FieldGeneratorMap::get(&this->field_generators_,field_00);
      (*pFVar5->_vptr_FieldGenerator[8])(pFVar5,local_18);
    }
    io::Printer::Print(local_18,"#if !defined(_MSC_VER) || _MSC_VER >= 1900\n");
    field._0_4_ = 0;
    while( true ) {
      iVar4 = (int)field;
      iVar3 = Descriptor::field_count(this->descriptor_);
      uVar9 = (undefined1)iVar3;
      if (iVar3 <= iVar4) break;
      local_98 = Descriptor::field(this->descriptor_,(int)field);
      pPVar1 = local_18;
      pDVar6 = FieldScope(local_98);
      ClassName_abi_cxx11_(&local_b8,(cpp *)pDVar6,(Descriptor *)0x0,(bool)uVar9);
      FieldConstantName_abi_cxx11_(&local_d8,(cpp *)local_98,field_01);
      io::Printer::Print(pPVar1,"const int $classname$::$constant_name$;\n","classname",&local_b8,
                         "constant_name",&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      field._0_4_ = (int)field + 1;
    }
    io::Printer::Print(local_18,"#endif  // !defined(_MSC_VER) || _MSC_VER >= 1900\n\n");
    GenerateStructors(this,local_18);
    io::Printer::Print(local_18,"\n");
    iVar4 = Descriptor::oneof_decl_count(this->descriptor_);
    if (0 < iVar4) {
      GenerateOneofClear(this,local_18);
      io::Printer::Print(local_18,"\n");
    }
    pFVar7 = Descriptor::file(this->descriptor_);
    bVar2 = HasGeneratedMethods(pFVar7,&this->options_);
    if (bVar2) {
      GenerateClear(this,local_18);
      io::Printer::Print(local_18,"\n");
      GenerateMergeFromCodedStream(this,local_18);
      io::Printer::Print(local_18,"\n");
      GenerateSerializeWithCachedSizes(this,local_18);
      io::Printer::Print(local_18,"\n");
      pFVar7 = Descriptor::file(this->descriptor_);
      bVar2 = HasFastArraySerialization(pFVar7,&this->options_);
      if (bVar2) {
        GenerateSerializeWithCachedSizesToArray(this,local_18);
        io::Printer::Print(local_18,"\n");
      }
      GenerateByteSize(this,local_18);
      io::Printer::Print(local_18,"\n");
      GenerateMergeFrom(this,local_18);
      io::Printer::Print(local_18,"\n");
      GenerateCopyFrom(this,local_18);
      io::Printer::Print(local_18,"\n");
      GenerateIsInitialized(this,local_18);
      io::Printer::Print(local_18,"\n");
    }
    GenerateSwap(this,local_18);
    io::Printer::Print(local_18,"\n");
    pFVar7 = Descriptor::file(this->descriptor_);
    bVar2 = HasDescriptorMethods(pFVar7,&this->options_);
    pPVar1 = local_18;
    if (bVar2) {
      pFVar7 = Descriptor::file(this->descriptor_);
      psVar8 = FileDescriptor::name_abi_cxx11_(pFVar7);
      FileLevelNamespace(&local_f8,psVar8);
      io::Printer::Print(pPVar1,
                         "::google::protobuf::Metadata $classname$::GetMetadata() const {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_metadata[kIndexInFileMessages];\n}\n\n"
                         ,"classname",&this->classname_,"file_namespace",&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    else {
      psVar8 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      io::Printer::Print(pPVar1,
                         "::std::string $classname$::GetTypeName() const {\n  return \"$type_name$\";\n}\n\n"
                         ,"classname",&this->classname_,"type_name",psVar8);
    }
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateClassMethods(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) {
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      printer->Print(
          "$parent$::$classname$::$classname$() {}\n"
          "$parent$::$classname$::$classname$(::google::protobuf::Arena* arena) : "
          "SuperType(arena) {}\n"
          "::google::protobuf::Metadata $parent$::$classname$::GetMetadata() const {\n"
          "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
          "  return $file_namespace$::file_level_metadata[$index$];\n"
          "}\n"
          "void $parent$::$classname$::MergeFrom(\n"
          "    const ::google::protobuf::Message& other) {\n"
          "  ::google::protobuf::Message::MergeFrom(other);\n"
          "}\n"
          "void $parent$::$classname$::MergeFrom(const $classname$& other) {\n"
          "  MergeFromInternal(other);\n"
          "}\n"
          "\n",
          "file_namespace", FileLevelNamespace(descriptor_->file()->name()),
          "parent", ClassName(descriptor_->containing_type(), false),
          "classname", classname_, "index",
          SimpleItoa(index_in_file_messages_));
    }
    return;
  }

  if (IsAnyMessage(descriptor_)) {
    printer->Print(
      "void $classname$::PackFrom(const ::google::protobuf::Message& message) {\n"
      "  _any_metadata_.PackFrom(message);\n"
      "}\n"
      "\n"
      "void $classname$::PackFrom(const ::google::protobuf::Message& message,\n"
      "                           const ::std::string& type_url_prefix) {\n"
      "  _any_metadata_.PackFrom(message, type_url_prefix);\n"
      "}\n"
      "\n"
      "bool $classname$::UnpackTo(::google::protobuf::Message* message) const {\n"
      "  return _any_metadata_.UnpackTo(message);\n"
      "}\n"
      "\n",
      "classname", classname_);
  }

  // Generate non-inline field definitions.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateNonInlineAccessorDefinitions(printer);
  }

  // Generate field number constants.
  printer->Print("#if !defined(_MSC_VER) || _MSC_VER >= 1900\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor *field = descriptor_->field(i);
    printer->Print(
      "const int $classname$::$constant_name$;\n",
      "classname", ClassName(FieldScope(field), false),
      "constant_name", FieldConstantName(field));
  }
  printer->Print(
    "#endif  // !defined(_MSC_VER) || _MSC_VER >= 1900\n"
    "\n");

  GenerateStructors(printer);
  printer->Print("\n");

  if (descriptor_->oneof_decl_count() > 0) {
    GenerateOneofClear(printer);
    printer->Print("\n");
  }

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    GenerateClear(printer);
    printer->Print("\n");

    GenerateMergeFromCodedStream(printer);
    printer->Print("\n");

    GenerateSerializeWithCachedSizes(printer);
    printer->Print("\n");

    if (HasFastArraySerialization(descriptor_->file(), options_)) {
      GenerateSerializeWithCachedSizesToArray(printer);
      printer->Print("\n");
    }

    GenerateByteSize(printer);
    printer->Print("\n");

    GenerateMergeFrom(printer);
    printer->Print("\n");

    GenerateCopyFrom(printer);
    printer->Print("\n");

    GenerateIsInitialized(printer);
    printer->Print("\n");
  }

  GenerateSwap(printer);
  printer->Print("\n");

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    printer->Print(
        "::google::protobuf::Metadata $classname$::GetMetadata() const {\n"
        "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
        "  return "
        "$file_namespace$::file_level_metadata[kIndexInFileMessages];\n"
        "}\n"
        "\n",
        "classname", classname_, "file_namespace",
        FileLevelNamespace(descriptor_->file()->name()));
  } else {
    printer->Print(
      "::std::string $classname$::GetTypeName() const {\n"
      "  return \"$type_name$\";\n"
      "}\n"
      "\n",
      "classname", classname_,
      "type_name", descriptor_->full_name());
  }

}